

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O2

void Hex::Hexdumper<unsigned_long>::output_asc_padding(ostream *os,int n)

{
  string padding;
  
  padding._M_dataplus._M_p = (pointer)&padding.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&padding,(long)(n << 3),' ');
  std::operator<<(os,(string *)&padding);
  std::__cxx11::string::~string((string *)&padding);
  return;
}

Assistant:

static void output_asc_padding(std::ostream& os, int n)
    {
        int oneunit = sizeof(T);
        std::string padding(n*oneunit, ' ');
        os << padding;
    }